

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

void __thiscall BasicBlock::UnlinkInstr(BasicBlock *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  Instr *pIVar6;
  bool local_39;
  Instr *instr_local;
  BasicBlock *this_local;
  
  bVar2 = Contains(this,instr);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd76,"(this->Contains(instr))","this->Contains(instr)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pIVar5 = GetFirstInstr(this);
  pIVar6 = GetLastInstr(this);
  if (pIVar5 == pIVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xd77,"(this->GetFirstInstr() != this->GetLastInstr())",
                       "this->GetFirstInstr() != this->GetLastInstr()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pIVar5 = GetFirstInstr(this);
  if (instr == pIVar5) {
    pIVar5 = GetFirstInstr(this);
    IVar3 = IR::Instr::GetKind(pIVar5);
    local_39 = true;
    if (IVar3 != InstrKindLabel) {
      local_39 = IR::Instr::IsProfiledLabelInstr(pIVar5);
    }
    if (local_39 != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0xd7a,"(!this->GetFirstInstr()->IsLabelInstr())",
                         "!this->GetFirstInstr()->IsLabelInstr()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    SetFirstInstr(this,instr->m_next);
  }
  else {
    pIVar5 = GetLastInstr(this);
    if (instr == pIVar5) {
      SetLastInstr(this,instr->m_prev);
    }
  }
  IR::Instr::Unlink(instr);
  return;
}

Assistant:

void
BasicBlock::UnlinkInstr(IR::Instr * instr)
{
    Assert(this->Contains(instr));
    Assert(this->GetFirstInstr() != this->GetLastInstr());
    if (instr == this->GetFirstInstr())
    {
        Assert(!this->GetFirstInstr()->IsLabelInstr());
        this->SetFirstInstr(instr->m_next);
    }
    else if (instr == this->GetLastInstr())
    {
        this->SetLastInstr(instr->m_prev);
    }

    instr->Unlink();
}